

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O1

VkFormat ktxTexture1_GetVkFormat(ktxTexture1 *This)

{
  ktx_uint32_t kVar1;
  ktx_uint32_t kVar2;
  bool bVar3;
  VkFormat VVar4;
  VkFormat VVar5;
  
  kVar1 = This->glInternalformat;
  if ((int)kVar1 < 0x8d70) {
    if ((int)kVar1 < 0x8814) {
      if ((int)kVar1 < 0x8229) {
        if ((int)kVar1 < 0x81a5) {
          switch(kVar1) {
          default:
            goto switchD_001fdd11_caseD_93be;
          case 0x8050:
            VVar4 = VK_FORMAT_R5G5B5A1_UNORM_PACK16;
            break;
          case 0x8051:
            VVar4 = VK_FORMAT_R8G8B8_UNORM;
            break;
          case 0x8052:
          case 0x8059:
            VVar4 = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
            break;
          case 0x8054:
            VVar4 = VK_FORMAT_R16G16B16_UNORM;
            break;
          case 0x8056:
            VVar4 = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
            break;
          case 0x8057:
            VVar4 = VK_FORMAT_A1R5G5B5_UNORM_PACK16;
            break;
          case 0x8058:
            VVar4 = VK_FORMAT_R8G8B8A8_UNORM;
            break;
          case 0x805b:
            VVar4 = VK_FORMAT_R16G16B16A16_UNORM;
          }
        }
        else if (kVar1 == 0x81a5) {
          VVar4 = VK_FORMAT_D16_UNORM;
        }
        else {
          if (kVar1 != 0x81a6) goto switchD_001fdd11_caseD_93be;
          VVar4 = VK_FORMAT_X8_D24_UNORM_PACK32;
        }
      }
      else {
        switch(kVar1) {
        case 0x8229:
          VVar4 = VK_FORMAT_R8_UNORM;
          break;
        case 0x822a:
          VVar4 = VK_FORMAT_R16_UNORM;
          break;
        case 0x822b:
          VVar4 = VK_FORMAT_R8G8_UNORM;
          break;
        case 0x822c:
          VVar4 = VK_FORMAT_R16G16_UNORM;
          break;
        case 0x822d:
          VVar4 = VK_FORMAT_R16_SFLOAT;
          break;
        case 0x822e:
          VVar4 = VK_FORMAT_R32_SFLOAT;
          break;
        case 0x822f:
          VVar4 = VK_FORMAT_R16G16_SFLOAT;
          break;
        case 0x8230:
          VVar4 = VK_FORMAT_R32G32_SFLOAT;
          break;
        case 0x8231:
          VVar4 = VK_FORMAT_R8_SINT;
          break;
        case 0x8232:
          VVar4 = VK_FORMAT_R8_UINT;
          break;
        case 0x8233:
          VVar4 = VK_FORMAT_R16_SINT;
          break;
        case 0x8234:
          VVar4 = VK_FORMAT_R16_UINT;
          break;
        case 0x8235:
          VVar4 = VK_FORMAT_R32_SINT;
          break;
        case 0x8236:
          VVar4 = VK_FORMAT_R32_UINT;
          break;
        case 0x8237:
          VVar4 = VK_FORMAT_R8G8_SINT;
          break;
        case 0x8238:
          VVar4 = VK_FORMAT_R8G8_UINT;
          break;
        case 0x8239:
          VVar4 = VK_FORMAT_R16G16_SINT;
          break;
        case 0x823a:
          VVar4 = VK_FORMAT_R16G16_UINT;
          break;
        case 0x823b:
          VVar4 = VK_FORMAT_R32G32_SINT;
          break;
        case 0x823c:
          VVar4 = VK_FORMAT_R32G32_UINT;
          break;
        default:
          switch(kVar1) {
          case 0x83f0:
            VVar4 = VK_FORMAT_BC1_RGB_UNORM_BLOCK;
            break;
          case 0x83f1:
            VVar4 = VK_FORMAT_BC1_RGBA_UNORM_BLOCK;
            break;
          case 0x83f2:
            VVar4 = VK_FORMAT_BC2_UNORM_BLOCK;
            break;
          case 0x83f3:
            VVar4 = VK_FORMAT_BC3_UNORM_BLOCK;
            break;
          default:
            goto switchD_001fdd11_caseD_93be;
          }
        }
      }
      goto LAB_001fe526;
    }
    if (0x8c39 < (int)kVar1) {
      if ((int)kVar1 < 0x8c92) {
        switch(kVar1) {
        case 0x8c3a:
          VVar4 = VK_FORMAT_B10G11R11_UFLOAT_PACK32;
          break;
        case 0x8c3b:
        case 0x8c3c:
        case 0x8c3e:
        case 0x8c3f:
        case 0x8c40:
        case 0x8c42:
          goto switchD_001fdd11_caseD_93be;
        case 0x8c3d:
          VVar4 = VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
          break;
        case 0x8c41:
          VVar4 = VK_FORMAT_R8G8B8_SRGB;
          break;
        case 0x8c43:
          VVar4 = VK_FORMAT_R8G8B8A8_SRGB;
          break;
        default:
          switch(kVar1) {
          case 0x8c4c:
            VVar4 = VK_FORMAT_BC1_RGB_SRGB_BLOCK;
            break;
          case 0x8c4d:
            VVar4 = VK_FORMAT_BC1_RGBA_SRGB_BLOCK;
            break;
          case 0x8c4e:
            VVar4 = VK_FORMAT_BC2_SRGB_BLOCK;
            break;
          case 0x8c4f:
            VVar4 = VK_FORMAT_BC3_SRGB_BLOCK;
            break;
          default:
            switch(kVar1) {
            case 0x8c70:
              goto switchD_001fdfae_caseD_8dbb;
            case 0x8c71:
              goto switchD_001fdfae_caseD_8dbc;
            case 0x8c72:
              goto switchD_001fdfae_caseD_8dbd;
            case 0x8c73:
              goto switchD_001fdfae_caseD_8dbe;
            }
            goto switchD_001fdd11_caseD_93be;
          }
        }
      }
      else {
        if ((int)kVar1 < 0x8d46) {
          if (0x8cab < (int)kVar1) {
            if (kVar1 == 0x8cac) goto LAB_001fe4db;
            if (kVar1 == 0x8cad) goto LAB_001fe124;
          }
          goto switchD_001fdd11_caseD_93be;
        }
        switch(kVar1) {
        case 0x8d46:
        case 0x8d47:
        case 0x8d49:
          goto switchD_001fdd11_caseD_93be;
        case 0x8d48:
          VVar4 = VK_FORMAT_S8_UINT;
          break;
        default:
          if (kVar1 != 0x8d62) {
            if (kVar1 == 0x8d64) goto switchD_001fdd88_caseD_9274;
            goto switchD_001fdd11_caseD_93be;
          }
          VVar4 = VK_FORMAT_R5G6B5_UNORM_PACK16;
        }
      }
      goto LAB_001fe526;
    }
    if ((int)kVar1 < 0x8b90) {
      switch(kVar1) {
      case 0x8814:
        VVar4 = VK_FORMAT_R32G32B32A32_SFLOAT;
        break;
      case 0x8815:
        VVar4 = VK_FORMAT_R32G32B32_SFLOAT;
        break;
      case 0x8816:
      case 0x8817:
      case 0x8818:
      case 0x8819:
        goto switchD_001fdd11_caseD_93be;
      case 0x881a:
        VVar4 = VK_FORMAT_R16G16B16A16_SFLOAT;
        break;
      case 0x881b:
        VVar4 = VK_FORMAT_R16G16B16_SFLOAT;
        break;
      default:
        switch(kVar1) {
        case 0x8a54:
        case 0x8a56:
          VVar4 = VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG;
          break;
        case 0x8a55:
        case 0x8a57:
          VVar4 = VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG;
          break;
        default:
          if (kVar1 != 0x88f0) goto switchD_001fdd11_caseD_93be;
          VVar4 = VK_FORMAT_D24_UNORM_S8_UINT;
        }
      }
      goto LAB_001fe526;
    }
    switch(kVar1) {
    case 0x8b90:
    case 0x8b91:
    case 0x8b92:
    case 0x8b93:
    case 0x8b94:
    case 0x8b95:
    case 0x8b96:
    case 0x8b97:
    case 0x8b98:
    case 0x8b99:
      goto switchD_001fdd11_caseD_93be;
    default:
      switch(kVar1) {
      case 0x8c00:
      case 0x8c02:
        VVar4 = VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG;
        break;
      case 0x8c01:
      case 0x8c03:
        VVar4 = VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG;
        break;
      default:
        goto switchD_001fdd11_caseD_93be;
      }
    }
    goto LAB_001fe526;
  }
  if (0x93af < (int)kVar1) {
    switch(kVar1) {
    case 0x93b0:
      VVar4 = VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
      break;
    case 0x93b1:
      VVar4 = VK_FORMAT_ASTC_5x4_UNORM_BLOCK;
      break;
    case 0x93b2:
      VVar4 = VK_FORMAT_ASTC_5x5_UNORM_BLOCK;
      break;
    case 0x93b3:
      VVar4 = VK_FORMAT_ASTC_6x5_UNORM_BLOCK;
      break;
    case 0x93b4:
      VVar4 = VK_FORMAT_ASTC_6x6_UNORM_BLOCK;
      break;
    case 0x93b5:
      VVar4 = VK_FORMAT_ASTC_8x5_UNORM_BLOCK;
      break;
    case 0x93b6:
      VVar4 = VK_FORMAT_ASTC_8x6_UNORM_BLOCK;
      break;
    case 0x93b7:
      VVar4 = VK_FORMAT_ASTC_8x8_UNORM_BLOCK;
      break;
    case 0x93b8:
      VVar4 = VK_FORMAT_ASTC_10x5_UNORM_BLOCK;
      break;
    case 0x93b9:
      VVar4 = VK_FORMAT_ASTC_10x6_UNORM_BLOCK;
      break;
    case 0x93ba:
      VVar4 = VK_FORMAT_ASTC_10x8_UNORM_BLOCK;
      break;
    case 0x93bb:
      VVar4 = VK_FORMAT_ASTC_10x10_UNORM_BLOCK;
      break;
    case 0x93bc:
      VVar4 = VK_FORMAT_ASTC_12x10_UNORM_BLOCK;
      break;
    case 0x93bd:
      VVar4 = VK_FORMAT_ASTC_12x12_UNORM_BLOCK;
      break;
    default:
      goto switchD_001fdd11_caseD_93be;
    case 0x93d0:
      VVar4 = VK_FORMAT_ASTC_4x4_SRGB_BLOCK;
      break;
    case 0x93d1:
      VVar4 = VK_FORMAT_ASTC_5x4_SRGB_BLOCK;
      break;
    case 0x93d2:
      VVar4 = VK_FORMAT_ASTC_5x5_SRGB_BLOCK;
      break;
    case 0x93d3:
      VVar4 = VK_FORMAT_ASTC_6x5_SRGB_BLOCK;
      break;
    case 0x93d4:
      VVar4 = VK_FORMAT_ASTC_6x6_SRGB_BLOCK;
      break;
    case 0x93d5:
      VVar4 = VK_FORMAT_ASTC_8x5_SRGB_BLOCK;
      break;
    case 0x93d6:
      VVar4 = VK_FORMAT_ASTC_8x6_SRGB_BLOCK;
      break;
    case 0x93d7:
      VVar4 = VK_FORMAT_ASTC_8x8_SRGB_BLOCK;
      break;
    case 0x93d8:
      VVar4 = VK_FORMAT_ASTC_10x5_SRGB_BLOCK;
      break;
    case 0x93d9:
      VVar4 = VK_FORMAT_ASTC_10x6_SRGB_BLOCK;
      break;
    case 0x93da:
      VVar4 = VK_FORMAT_ASTC_10x8_SRGB_BLOCK;
      break;
    case 0x93db:
      VVar4 = VK_FORMAT_ASTC_10x10_SRGB_BLOCK;
      break;
    case 0x93dc:
      VVar4 = VK_FORMAT_ASTC_12x10_SRGB_BLOCK;
      break;
    case 0x93dd:
      VVar4 = VK_FORMAT_ASTC_12x12_SRGB_BLOCK;
      break;
    case 0x93f0:
      VVar4 = VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG;
      break;
    case 0x93f1:
      VVar4 = VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG;
    }
    goto LAB_001fe526;
  }
  if (0x8f93 < (int)kVar1) {
    if ((int)kVar1 < 0x9137) {
      if ((int)kVar1 < 0x8fbd) {
        switch(kVar1) {
        case 0x8f94:
          VVar4 = VK_FORMAT_R8_SNORM;
          break;
        case 0x8f95:
          VVar4 = VK_FORMAT_R8G8_SNORM;
          break;
        case 0x8f96:
          VVar4 = VK_FORMAT_R8G8B8_SNORM;
          break;
        case 0x8f97:
          VVar4 = VK_FORMAT_R8G8B8A8_SNORM;
          break;
        case 0x8f98:
          VVar4 = VK_FORMAT_R16_SNORM;
          break;
        case 0x8f99:
          VVar4 = VK_FORMAT_R16G16_SNORM;
          break;
        case 0x8f9a:
          VVar4 = VK_FORMAT_R16G16B16_SNORM;
          break;
        case 0x8f9b:
          VVar4 = VK_FORMAT_R16G16B16A16_SNORM;
          break;
        default:
          goto switchD_001fdd11_caseD_93be;
        }
      }
      else if (kVar1 == 0x8fbd) {
        VVar4 = VK_FORMAT_R8_SRGB;
      }
      else if (kVar1 == 0x8fbe) {
        VVar4 = VK_FORMAT_R8G8_SRGB;
      }
      else {
        if (kVar1 != 0x906f) goto switchD_001fdd11_caseD_93be;
        VVar4 = VK_FORMAT_A2R10G10B10_UINT_PACK32;
      }
    }
    else {
      switch(kVar1) {
      case 0x9270:
        VVar4 = VK_FORMAT_EAC_R11_UNORM_BLOCK;
        break;
      case 0x9271:
        VVar4 = VK_FORMAT_EAC_R11_SNORM_BLOCK;
        break;
      case 0x9272:
        VVar4 = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
        break;
      case 0x9273:
        VVar4 = VK_FORMAT_EAC_R11G11_SNORM_BLOCK;
        break;
      case 0x9274:
switchD_001fdd88_caseD_9274:
        VVar4 = VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        break;
      case 0x9275:
        VVar4 = VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
        break;
      case 0x9276:
        VVar4 = VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
        break;
      case 0x9277:
        VVar4 = VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
        break;
      case 0x9278:
        VVar4 = VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        break;
      case 0x9279:
        VVar4 = VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;
        break;
      default:
        if (kVar1 == 0x9137) {
          VVar4 = VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG;
        }
        else {
          if (kVar1 != 0x9138) goto switchD_001fdd11_caseD_93be;
          VVar4 = VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG;
        }
      }
    }
    goto LAB_001fe526;
  }
  if (0x8dab < (int)kVar1) {
    switch(kVar1) {
    case 0x8dbb:
switchD_001fdfae_caseD_8dbb:
      VVar4 = VK_FORMAT_BC4_UNORM_BLOCK;
      break;
    case 0x8dbc:
switchD_001fdfae_caseD_8dbc:
      VVar4 = VK_FORMAT_BC4_SNORM_BLOCK;
      break;
    case 0x8dbd:
switchD_001fdfae_caseD_8dbd:
      VVar4 = VK_FORMAT_BC5_UNORM_BLOCK;
      break;
    case 0x8dbe:
switchD_001fdfae_caseD_8dbe:
      VVar4 = VK_FORMAT_BC5_SNORM_BLOCK;
      break;
    default:
      switch(kVar1) {
      case 0x8e8c:
        VVar4 = VK_FORMAT_BC7_UNORM_BLOCK;
        break;
      case 0x8e8d:
        VVar4 = VK_FORMAT_BC7_SRGB_BLOCK;
        break;
      case 0x8e8e:
        VVar4 = VK_FORMAT_BC6H_SFLOAT_BLOCK;
        break;
      case 0x8e8f:
        VVar4 = VK_FORMAT_BC6H_UFLOAT_BLOCK;
        break;
      default:
        if (kVar1 != 0x8dac) goto switchD_001fdd11_caseD_93be;
LAB_001fe124:
        VVar4 = VK_FORMAT_D32_SFLOAT_S8_UINT;
      }
    }
    goto LAB_001fe526;
  }
  switch(kVar1) {
  case 0x8d70:
    VVar4 = VK_FORMAT_R32G32B32A32_UINT;
    break;
  case 0x8d71:
    VVar4 = VK_FORMAT_R32G32B32_UINT;
    break;
  case 0x8d72:
  case 0x8d73:
  case 0x8d74:
  case 0x8d75:
  case 0x8d78:
  case 0x8d79:
  case 0x8d7a:
  case 0x8d7b:
  case 0x8d7e:
  case 0x8d7f:
  case 0x8d80:
  case 0x8d81:
switchD_001fdd11_caseD_93be:
    VVar4 = VK_FORMAT_UNDEFINED;
    bVar3 = true;
    goto LAB_001fe528;
  case 0x8d76:
    VVar4 = VK_FORMAT_R16G16B16A16_UINT;
    break;
  case 0x8d77:
    VVar4 = VK_FORMAT_R16G16B16_UINT;
    break;
  case 0x8d7c:
    VVar4 = VK_FORMAT_R8G8B8A8_UINT;
    break;
  case 0x8d7d:
    VVar4 = VK_FORMAT_R8G8B8_UINT;
    break;
  case 0x8d82:
    VVar4 = VK_FORMAT_R32G32B32A32_SINT;
    break;
  case 0x8d83:
    VVar4 = VK_FORMAT_R32G32B32_SINT;
    break;
  default:
    switch(kVar1) {
    case 0x8d88:
      VVar4 = VK_FORMAT_R16G16B16A16_SINT;
      break;
    case 0x8d89:
      VVar4 = VK_FORMAT_R16G16B16_SINT;
      break;
    case 0x8d8a:
    case 0x8d8b:
    case 0x8d8c:
    case 0x8d8d:
      goto switchD_001fdd11_caseD_93be;
    case 0x8d8e:
      VVar4 = VK_FORMAT_R8G8B8A8_SINT;
      break;
    case 0x8d8f:
      VVar4 = VK_FORMAT_R8G8B8_SINT;
      break;
    default:
      if (kVar1 != 0x8dab) goto switchD_001fdd11_caseD_93be;
LAB_001fe4db:
      VVar4 = VK_FORMAT_D32_SFLOAT;
    }
  }
LAB_001fe526:
  bVar3 = false;
LAB_001fe528:
  if (!bVar3) {
    return VVar4;
  }
  kVar1 = This->glFormat;
  kVar2 = This->glType;
  if ((int)kVar2 < 0x8362) {
    switch(kVar2) {
    case 0x1400:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          break;
        case 0x1903:
          return VK_FORMAT_R8_SNORM;
        case 0x1907:
          return VK_FORMAT_R8G8B8_SNORM;
        case 0x1908:
          return VK_FORMAT_R8G8B8A8_SNORM;
        default:
          if (kVar1 == 0x80e0) {
            return VK_FORMAT_B8G8R8_SNORM;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_B8G8R8A8_SNORM;
          }
        }
      }
      else if ((int)kVar1 < 0x8d94) {
        if (kVar1 == 0x8227) {
          return VK_FORMAT_R8G8_SNORM;
        }
        if (kVar1 == 0x8228) {
          return VK_FORMAT_R8G8_SINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          return VK_FORMAT_R8_SINT;
        case 0x8d98:
          return VK_FORMAT_R8G8B8_SINT;
        case 0x8d99:
          return VK_FORMAT_R8G8B8A8_SINT;
        case 0x8d9a:
          return VK_FORMAT_B8G8R8_SINT;
        case 0x8d9b:
          return VK_FORMAT_B8G8R8A8_SINT;
        }
      }
      break;
    case 0x1401:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
          return VK_FORMAT_S8_UINT;
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          break;
        case 0x1903:
          return VK_FORMAT_R8_UNORM;
        case 0x1907:
          return VK_FORMAT_R8G8B8_UNORM;
        case 0x1908:
          return VK_FORMAT_R8G8B8A8_UNORM;
        default:
          if (kVar1 == 0x80e0) {
            return VK_FORMAT_B8G8R8_UNORM;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_B8G8R8A8_UNORM;
          }
        }
      }
      else if ((int)kVar1 < 0x8d94) {
        if (kVar1 == 0x8227) {
          return VK_FORMAT_R8G8_UNORM;
        }
        if (kVar1 == 0x8228) {
          return VK_FORMAT_R8G8_UINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          return VK_FORMAT_R8_UINT;
        case 0x8d98:
          return VK_FORMAT_R8G8B8_UINT;
        case 0x8d99:
          return VK_FORMAT_R8G8B8A8_UINT;
        case 0x8d9a:
          return VK_FORMAT_B8G8R8_UINT;
        case 0x8d9b:
          return VK_FORMAT_B8G8R8A8_UINT;
        }
      }
      break;
    case 0x1402:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          break;
        case 0x1903:
          return VK_FORMAT_R16_SNORM;
        case 0x1907:
          return VK_FORMAT_R16G16B16_SNORM;
        case 0x1908:
          return VK_FORMAT_R16G16B16A16_SNORM;
        default:
switchD_001febb8_default:
        }
      }
      else if ((int)kVar1 < 0x8d94) {
        if (kVar1 == 0x8227) {
          return VK_FORMAT_R16G16_SNORM;
        }
        if (kVar1 == 0x8228) {
          return VK_FORMAT_R16G16_SINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          return VK_FORMAT_R16_SINT;
        case 0x8d98:
          return VK_FORMAT_R16G16B16_SINT;
        case 0x8d99:
          return VK_FORMAT_R16G16B16A16_SINT;
        }
      }
      break;
    case 0x1403:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1902:
          return VK_FORMAT_D16_UNORM;
        case 0x1903:
          return VK_FORMAT_R16_UNORM;
        case 0x1907:
          return VK_FORMAT_R16G16B16_UNORM;
        case 0x1908:
          return VK_FORMAT_R16G16B16A16_UNORM;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if (kVar1 == 0x8227) {
          return VK_FORMAT_R16G16_UNORM;
        }
        if (kVar1 == 0x8228) {
          return VK_FORMAT_R16G16_UINT;
        }
        if (kVar1 == 0x84f9) {
          return VK_FORMAT_D16_UNORM_S8_UINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          return VK_FORMAT_R16_UINT;
        case 0x8d98:
          return VK_FORMAT_R16G16B16_UINT;
        case 0x8d99:
          return VK_FORMAT_R16G16B16A16_UINT;
        }
      }
      break;
    case 0x1404:
      VVar4 = VK_FORMAT_R32_SINT;
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1903:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x1907:
switchD_001fe8aa_caseD_8d94:
          return VK_FORMAT_R32G32B32_SINT;
        case 0x1908:
switchD_001fe774_caseD_8d99:
          VVar4 = VK_FORMAT_R32G32B32A32_SINT;
          goto switchD_001fe8aa_caseD_8d94;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if ((kVar1 == 0x8227) || (kVar1 == 0x8228)) {
          return VK_FORMAT_R32G32_SINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d98:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d99:
          goto switchD_001fe774_caseD_8d99;
        }
      }
      break;
    case 0x1405:
      VVar4 = VK_FORMAT_R32_UINT;
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1902:
          return VK_FORMAT_X8_D24_UNORM_PACK32;
        case 0x1903:
          return VK_FORMAT_R32_UINT;
        case 0x1907:
switchD_001fe8aa_caseD_8d94:
          return VK_FORMAT_R32G32B32_UINT;
        case 0x1908:
switchD_001fe8aa_caseD_8d94:
          return VK_FORMAT_R32G32B32A32_UINT;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if ((kVar1 == 0x8227) || (kVar1 == 0x8228)) {
          return VK_FORMAT_R32G32_UINT;
        }
        if (kVar1 == 0x84f9) {
          return VK_FORMAT_D24_UNORM_S8_UINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d98:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d99:
          goto switchD_001fe8aa_caseD_8d94;
        }
      }
      break;
    case 0x1406:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1902:
          return VK_FORMAT_D32_SFLOAT;
        case 0x1903:
          return VK_FORMAT_R32_SFLOAT;
        case 0x1907:
          return VK_FORMAT_R32G32B32_SFLOAT;
        case 0x1908:
          return VK_FORMAT_R32G32B32A32_SFLOAT;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if (kVar1 == 0x8227) {
          return VK_FORMAT_R32G32_SFLOAT;
        }
        if ((kVar1 != 0x8228) && (kVar1 == 0x84f9)) {
          return VK_FORMAT_D32_SFLOAT_S8_UINT;
        }
      }
      break;
    case 0x1407:
    case 0x1408:
    case 0x1409:
    case 0x140c:
    case 0x140d:
      break;
    case 0x140a:
      VVar4 = VK_FORMAT_R64_SFLOAT;
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1903:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x1907:
switchD_001fe8aa_caseD_8d94:
          return VK_FORMAT_R64G64B64_SFLOAT;
        case 0x1908:
switchD_001fe922_caseD_8d99:
          VVar4 = VK_FORMAT_R64G64B64A64_SFLOAT;
          goto switchD_001fe8aa_caseD_8d94;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if ((kVar1 == 0x8227) || (kVar1 == 0x8228)) {
          return VK_FORMAT_R64G64_SFLOAT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d98:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d99:
          goto switchD_001fe922_caseD_8d99;
        }
      }
      break;
    case 0x140b:
switchD_001fe55d_caseD_140b:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1903:
          return VK_FORMAT_R16_SFLOAT;
        case 0x1907:
          return VK_FORMAT_R16G16B16_SFLOAT;
        case 0x1908:
          return VK_FORMAT_R16G16B16A16_SFLOAT;
        default:
          goto switchD_001febb8_default;
        }
      }
      if (((int)kVar1 < 0x8d94) && (kVar1 == 0x8227)) {
        return VK_FORMAT_R16G16_SFLOAT;
      }
      break;
    case 0x140e:
      VVar4 = VK_FORMAT_R64_SINT;
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1903:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x1907:
switchD_001fe8aa_caseD_8d94:
          return VK_FORMAT_R64G64B64_SINT;
        case 0x1908:
switchD_001fe8aa_caseD_8d99:
          VVar4 = VK_FORMAT_R64G64B64A64_SINT;
          goto switchD_001fe8aa_caseD_8d94;
        default:
          goto switchD_001febb8_default;
        }
      }
      if ((int)kVar1 < 0x8d94) {
        if ((kVar1 == 0x8227) || (kVar1 == 0x8228)) {
          return VK_FORMAT_R64G64_SINT;
        }
      }
      else {
        switch(kVar1) {
        case 0x8d94:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d98:
          goto switchD_001fe8aa_caseD_8d94;
        case 0x8d99:
          goto switchD_001fe8aa_caseD_8d99;
        }
      }
      break;
    case 0x140f:
      if ((int)kVar1 < 0x8227) {
        switch(kVar1) {
        case 0x1901:
        case 0x1902:
        case 0x1904:
        case 0x1905:
        case 0x1906:
          goto switchD_001fe55d_caseD_1407;
        case 0x1903:
          return VK_FORMAT_R64_UINT;
        case 0x1907:
          return VK_FORMAT_R64G64B64_UINT;
        case 0x1908:
          return VK_FORMAT_R64G64B64A64_UINT;
        default:
          goto switchD_001febb8_default;
        }
      }
      if (((int)kVar1 < 0x8d94) && (kVar1 == 0x8227)) {
        return VK_FORMAT_R64G64_UINT;
      }
      break;
    default:
      switch(kVar2) {
      case 0x8032:
        if (kVar1 == 0x1907) {
          return VK_FORMAT_UNDEFINED;
        }
        if (kVar1 == 0x8d98) {
          return VK_FORMAT_UNDEFINED;
        }
        __assert_fail("format == GL_RGB || format == GL_RGB_INTEGER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x160,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8033:
        if ((int)kVar1 < 0x8d98) {
          if (kVar1 == 0x1907) {
            return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
          }
        }
        else {
          if (kVar1 == 0x8d98) {
            return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
          }
          if (kVar1 == 0x8d9b) {
            return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
          }
        }
        __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x16c,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8034:
        if ((int)kVar1 < 0x8d98) {
          if (kVar1 == 0x1907) {
            return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
          }
        }
        else {
          if (kVar1 == 0x8d98) {
            return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
          }
          if (kVar1 == 0x8d9b) {
            return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
          }
        }
        __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x172,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8035:
        if ((int)kVar1 < 0x8d98) {
          if ((kVar1 != 0x1907) && (kVar1 != 0x80e1)) {
LAB_001ff2ac:
            __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                          ,0x178,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)")
            ;
          }
        }
        else if ((kVar1 != 0x8d98) && (kVar1 != 0x8d9b)) goto LAB_001ff2ac;
        VVar5 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_R8G8B8A8_UNORM;
        VVar4 = VK_FORMAT_R8G8B8A8_UINT;
        goto LAB_001fed39;
      case 0x8036:
        if ((int)kVar1 < 0x8d98) {
          if ((kVar1 != 0x1907) && (kVar1 != 0x80e1)) {
LAB_001ff28d:
            __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                          ,0x17e,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)")
            ;
          }
        }
        else if ((kVar1 != 0x8d98) && (kVar1 != 0x8d9b)) goto LAB_001ff28d;
        VVar5 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A2R10G10B10_UNORM_PACK32;
        VVar4 = VK_FORMAT_A2R10G10B10_UINT_PACK32;
        goto LAB_001fed39;
      }
    }
  }
  else {
    if ((int)kVar2 < 0x84fa) {
      switch(kVar2) {
      case 0x8362:
        if (kVar1 == 0x80e0) {
          return VK_FORMAT_UNDEFINED;
        }
        if (kVar1 == 0x8d9a) {
          return VK_FORMAT_UNDEFINED;
        }
        __assert_fail("format == GL_BGR || format == GL_BGR_INTEGER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x163,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8363:
        if (kVar1 == 0x1907) {
          return VK_FORMAT_R5G6B5_UNORM_PACK16;
        }
        if (kVar1 == 0x8d98) {
          return VK_FORMAT_R5G6B5_UNORM_PACK16;
        }
        __assert_fail("format == GL_RGB || format == GL_RGB_INTEGER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x166,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8364:
        if (kVar1 == 0x80e0) {
          return VK_FORMAT_B5G6R5_UNORM_PACK16;
        }
        if (kVar1 == 0x8d9a) {
          return VK_FORMAT_B5G6R5_UNORM_PACK16;
        }
        __assert_fail("format == GL_BGR || format == GL_BGR_INTEGER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x169,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8365:
        if ((int)kVar1 < 0x8d98) {
          if (kVar1 == 0x1907) {
            return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
          }
        }
        else {
          if (kVar1 == 0x8d98) {
            return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
          }
          if (kVar1 == 0x8d9b) {
            return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
          }
        }
        __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x16f,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8366:
        if ((int)kVar1 < 0x8d98) {
          if (kVar1 == 0x1907) {
            return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
          }
          if (kVar1 == 0x80e1) {
            return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
          }
        }
        else {
          if (kVar1 == 0x8d98) {
            return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
          }
          if (kVar1 == 0x8d9b) {
            return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
          }
        }
        __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x175,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      case 0x8367:
        if ((int)kVar1 < 0x8d98) {
          if ((kVar1 != 0x1907) && (kVar1 != 0x80e1)) {
LAB_001ff24f:
            __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                          ,0x17b,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)")
            ;
          }
        }
        else if ((kVar1 != 0x8d98) && (kVar1 != 0x8d9b)) goto LAB_001ff24f;
        VVar5 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A8B8G8R8_UNORM_PACK32;
        VVar4 = VK_FORMAT_A8B8G8R8_UINT_PACK32;
        break;
      case 0x8368:
        if ((int)kVar1 < 0x8d98) {
          if ((kVar1 != 0x1907) && (kVar1 != 0x80e1)) {
LAB_001ff26e:
            __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                          ,0x181,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)")
            ;
          }
        }
        else if ((kVar1 != 0x8d98) && (kVar1 != 0x8d9b)) goto LAB_001ff26e;
        VVar5 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A2B10G10R10_UNORM_PACK32;
        VVar4 = VK_FORMAT_A2B10G10R10_UINT_PACK32;
        break;
      default:
        goto switchD_001fe55d_caseD_1407;
      }
LAB_001fed39:
      if (kVar1 == 0x8d98) {
        return VVar4;
      }
      return VVar5;
    }
    if ((int)kVar2 < 0x8c3e) {
      if (kVar2 == 0x84fa) {
        if (kVar1 == 0x84f9) {
          return VK_FORMAT_D24_UNORM_S8_UINT;
        }
        __assert_fail("format == GL_DEPTH_STENCIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x18a,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      }
      if (kVar2 == 0x8c3b) {
        if (kVar1 == 0x1907) {
          return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
        }
        if (kVar1 == 0x80e0) {
          return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
        }
        __assert_fail("format == GL_RGB || format == GL_BGR",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x184,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      }
    }
    else {
      if (kVar2 == 0x8c3e) {
        if (kVar1 == 0x1907) {
          return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
        }
        if (kVar1 == 0x80e0) {
          return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
        }
        __assert_fail("format == GL_RGB || format == GL_BGR",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x187,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      }
      if (kVar2 == 0x8d61) goto switchD_001fe55d_caseD_140b;
      if (kVar2 == 0x8dad) {
        if (kVar1 == 0x84f9) {
          return VK_FORMAT_D32_SFLOAT_S8_UINT;
        }
        __assert_fail("format == GL_DEPTH_STENCIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                      ,0x18d,"VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
      }
    }
  }
switchD_001fe55d_caseD_1407:
  VVar4 = VK_FORMAT_UNDEFINED;
switchD_001fe8aa_caseD_8d94:
  return VVar4;
}

Assistant:

VkFormat
ktxTexture1_GetVkFormat(ktxTexture1* This)
{
    VkFormat vkFormat;

    vkFormat = vkGetFormatFromOpenGLInternalFormat(This->glInternalformat);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        vkFormat = vkGetFormatFromOpenGLFormat(This->glFormat,
            This->glType);
    }
    return vkFormat;
}